

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O0

int xmlModuleSymbol(xmlModulePtr module,char *name,void **symbol)

{
  char *local_40;
  int rc;
  void **symbol_local;
  char *name_local;
  xmlModulePtr module_local;
  
  if (((module == (xmlModulePtr)0x0) || (symbol == (void **)0x0)) || (name == (char *)0x0)) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x1a,0x1324,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"null parameter\n");
    module_local._4_4_ = -1;
  }
  else {
    module_local._4_4_ = xmlModulePlatformSymbol(module->handle,name,symbol);
    if (module_local._4_4_ == -1) {
      local_40 = name;
      if (name == (char *)0x0) {
        local_40 = "NULL";
      }
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x1a,0x1324,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,name,
                      (char *)0x0,0,0,"failed to find symbol: %s\n",local_40);
    }
  }
  return module_local._4_4_;
}

Assistant:

int
xmlModuleSymbol(xmlModulePtr module, const char *name, void **symbol)
{
    int rc = -1;

    if ((NULL == module) || (symbol == NULL) || (name == NULL)) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_OPEN, XML_ERR_FATAL, NULL, 0, 0,
                        NULL, NULL, 0, 0, "null parameter\n");
        return rc;
    }

    rc = xmlModulePlatformSymbol(module->handle, name, symbol);

    if (rc == -1) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_OPEN, XML_ERR_FATAL, NULL, 0, 0,
                        name, NULL, 0, 0,
                        "failed to find symbol: %s\n",
			(name == NULL ? "NULL" : name));
        return rc;
    }

    return rc;
}